

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nlsol_ex_nl.h
# Opt level: O0

int __thiscall
ExampleNLFeeder::CountNNZ<std::vector<double,std::allocator<double>>>
          (ExampleNLFeeder *this,vector<double,_std::allocator<double>_> *vec)

{
  bool bVar1;
  const_iterator __lhs;
  reference pdVar2;
  const_iterator it;
  int n;
  const_iterator in_stack_ffffffffffffffd8;
  int local_14;
  
  local_14 = 0;
  __lhs = std::begin<std::vector<double,std::allocator<double>>>
                    (in_stack_ffffffffffffffd8._M_current);
  while( true ) {
    in_stack_ffffffffffffffd8 =
         std::end<std::vector<double,std::allocator<double>>>(in_stack_ffffffffffffffd8._M_current);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                        *)__lhs._M_current,
                       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                        *)in_stack_ffffffffffffffd8._M_current);
    if (!bVar1) break;
    pdVar2 = __gnu_cxx::
             __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
             operator*((__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                        *)&stack0xffffffffffffffe0);
    local_14 = (uint)(*pdVar2 != 0.0) + local_14;
    __gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++((__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> *)
               &stack0xffffffffffffffe0);
  }
  return local_14;
}

Assistant:

int CountNNZ(const DenseVec& vec) {
    int n=0;
    for (auto it=std::begin(vec);
         std::end(vec) != it; ++it)
      n += (*it != 0);
    return n;
  }